

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

CATNDepartureSet<wchar_t> * __thiscall
Centaurus::CompositeATN<wchar_t>::build_departure_set
          (CATNDepartureSet<wchar_t> *__return_storage_ptr__,CompositeATN<wchar_t> *this,
          CATNClosure *closure)

{
  bool bVar1;
  int color;
  reference this_00;
  ATNPath *path;
  PriorityChain *priority;
  CATNClosureElement *p;
  iterator __end2;
  iterator __begin2;
  CATNClosure *__range2;
  undefined1 local_60 [8];
  ATNStateStack stack;
  CATNDepartureSetFactory<wchar_t> deptset_factory;
  CATNClosure *closure_local;
  CompositeATN<wchar_t> *this_local;
  
  CATNDepartureSetFactory<wchar_t>::CATNDepartureSetFactory
            ((CATNDepartureSetFactory<wchar_t> *)
             &stack.
              super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              .
              super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ATNPath::ATNPath((ATNPath *)local_60);
  __end2 = std::
           set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
           ::begin(closure);
  p = (CATNClosureElement *)
      std::
      set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
      ::end(closure);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&p);
    if (!bVar1) break;
    this_00 = std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>::operator*(&__end2);
    path = CATNClosureElement::path(this_00);
    color = CATNClosureElement::color(this_00);
    priority = CATNClosureElement::priority(this_00);
    build_departure_set_r
              (this,(CATNDepartureSetFactory<wchar_t> *)
                    &stack.
                     super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     .
                     super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,path,color,priority,
               (ATNStateStack *)local_60);
    std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>::operator++(&__end2);
  }
  CATNDepartureSetFactory<wchar_t>::build_departure_set
            (__return_storage_ptr__,
             (CATNDepartureSetFactory<wchar_t> *)
             &stack.
              super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              .
              super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ATNPath::~ATNPath((ATNPath *)local_60);
  CATNDepartureSetFactory<wchar_t>::~CATNDepartureSetFactory
            ((CATNDepartureSetFactory<wchar_t> *)
             &stack.
              super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              .
              super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

CATNDepartureSet<TCHAR> build_departure_set(const CATNClosure& closure) const
    {
        CATNDepartureSetFactory<TCHAR> deptset_factory;

        ATNStateStack stack;

        for (const auto& p : closure)
        {
            build_departure_set_r(deptset_factory, p.path(), p.color(), p.priority(), stack);
        }

        return deptset_factory.build_departure_set();
    }